

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O1

void Vec_QuePush(Vec_Que_t *p,int v)

{
  size_t sVar1;
  int iVar2;
  int *piVar3;
  float *pfVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  
  iVar2 = p->nCap;
  if (iVar2 <= p->nSize) {
    iVar6 = p->nSize + 1;
    iVar7 = iVar2 * 2;
    if (iVar6 == iVar7 || SBORROW4(iVar6,iVar7) != iVar6 + iVar2 * -2 < 0) {
      iVar6 = iVar7;
    }
    if (iVar2 < iVar6) {
      lVar12 = (long)iVar6;
      sVar1 = lVar12 * 4;
      if (p->pHeap == (int *)0x0) {
        piVar5 = (int *)malloc(sVar1);
      }
      else {
        piVar5 = (int *)realloc(p->pHeap,sVar1);
      }
      p->pHeap = piVar5;
      if (p->pOrder == (int *)0x0) {
        piVar5 = (int *)malloc(sVar1);
      }
      else {
        piVar5 = (int *)realloc(p->pOrder,sVar1);
      }
      p->pOrder = piVar5;
      memset(p->pHeap + p->nCap,0xff,(lVar12 - p->nCap) * 4);
      memset(p->pOrder + p->nCap,0xff,(lVar12 - p->nCap) * 4);
      p->nCap = iVar6;
    }
  }
  iVar2 = p->nCap;
  if (iVar2 <= v) {
    iVar6 = v + 1;
    iVar7 = iVar2 * 2;
    if (iVar6 != iVar7 && SBORROW4(iVar6,iVar7) == iVar6 + iVar2 * -2 < 0) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      lVar12 = (long)iVar7;
      sVar1 = lVar12 * 4;
      if (p->pHeap == (int *)0x0) {
        piVar5 = (int *)malloc(sVar1);
      }
      else {
        piVar5 = (int *)realloc(p->pHeap,sVar1);
      }
      p->pHeap = piVar5;
      if (p->pOrder == (int *)0x0) {
        piVar5 = (int *)malloc(sVar1);
      }
      else {
        piVar5 = (int *)realloc(p->pOrder,sVar1);
      }
      p->pOrder = piVar5;
      memset(p->pHeap + p->nCap,0xff,(lVar12 - p->nCap) * 4);
      memset(p->pOrder + p->nCap,0xff,(lVar12 - p->nCap) * 4);
      p->nCap = iVar7;
    }
  }
  iVar2 = p->nSize;
  if (p->nCap <= iVar2) {
    __assert_fail("p->nSize < p->nCap",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
  }
  piVar5 = p->pOrder;
  if (piVar5[v] != -1) {
    __assert_fail("p->pOrder[v] == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
  }
  piVar3 = p->pHeap;
  if (piVar3[iVar2] != -1) {
    __assert_fail("p->pHeap[p->nSize] == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
  }
  piVar5[v] = iVar2;
  iVar2 = p->nSize;
  p->nSize = iVar2 + 1;
  piVar3[iVar2] = v;
  pfVar4 = *p->pCostsFlt;
  if (pfVar4 == (float *)0x0) {
    fVar13 = (float)v;
  }
  else {
    fVar13 = pfVar4[v];
  }
  uVar10 = piVar5[v];
  uVar9 = (ulong)(int)uVar10;
  if (uVar9 == 0xffffffffffffffff) {
    __assert_fail("p->pOrder[v] != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
  }
  if (piVar3[uVar9] != v) {
    __assert_fail("p->pHeap[i] == v",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
  }
  if (1 < (int)uVar10) {
    uVar11 = (ulong)uVar10;
    do {
      uVar8 = (uint)uVar9;
      uVar11 = uVar11 >> 1;
      iVar2 = piVar3[uVar11];
      if (pfVar4 == (float *)0x0) {
        fVar14 = (float)iVar2;
      }
      else {
        fVar14 = pfVar4[iVar2];
      }
      uVar10 = uVar8;
      if (fVar13 <= fVar14) break;
      piVar3[uVar9 & 0xffffffff] = iVar2;
      piVar5[iVar2] = uVar8;
      uVar9 = uVar11;
      uVar10 = (uint)uVar11;
    } while (3 < uVar8);
  }
  piVar3[(int)uVar10] = v;
  piVar5[v] = uVar10;
  return;
}

Assistant:

static inline void Vec_QuePush( Vec_Que_t * p, int v )
{
    if ( p->nSize >= p->nCap )
        Vec_QueGrow( p, Abc_MaxInt(p->nSize+1, 2*p->nCap) );
    if ( v >= p->nCap )
        Vec_QueGrow( p, Abc_MaxInt(v+1, 2*p->nCap) );
    assert( p->nSize < p->nCap );
    assert( p->pOrder[v] == -1 );
    assert( p->pHeap[p->nSize] == -1 );
    p->pOrder[v] = p->nSize;
    p->pHeap[p->nSize++] = v;
    Vec_QueMoveUp( p, v );
}